

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

void __thiscall chrono::ChOptimizerHybrid::ChOptimizerHybrid(ChOptimizerHybrid *this)

{
  ChOptimizerGenetic *this_00;
  ChOptimizerLocal *this_01;
  
  ChOptimizer::ChOptimizer(&this->super_ChOptimizer);
  (this->super_ChOptimizer)._vptr_ChOptimizer = (_func_int **)&PTR__ChOptimizerHybrid_011869d0;
  this_00 = (ChOptimizerGenetic *)::operator_new(0x210);
  ChOptimizerGenetic::ChOptimizerGenetic(this_00);
  this->genetic_opt = this_00;
  this_01 = (ChOptimizerLocal *)::operator_new(0x188);
  ChOptimizerLocal::ChOptimizerLocal(this_01);
  this->local_opt = this_01;
  this->current_phase = 0;
  this->use_genetic = true;
  this->use_local = true;
  return;
}

Assistant:

ChOptimizerHybrid::ChOptimizerHybrid()
    : ChOptimizer()  // note: implicit
{
    genetic_opt = new ChOptimizerGenetic();
    local_opt = new ChOptimizerLocal();

    current_phase = 0;
    use_genetic = true;
    use_local = true;
}